

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int memjrnlClose(sqlite3_file *pJfd)

{
  sqlite3_io_methods *psVar1;
  sqlite3_io_methods *p;
  
  p = pJfd[3].pMethods;
  while (p != (sqlite3_io_methods *)0x0) {
    psVar1 = *(sqlite3_io_methods **)p;
    sqlite3_free(p);
    p = psVar1;
  }
  pJfd[3].pMethods = (sqlite3_io_methods *)0x0;
  return 0;
}

Assistant:

static int memjrnlClose(sqlite3_file *pJfd){
  MemJournal *p = (MemJournal *)pJfd;
  memjrnlFreeChunks(p);
  return SQLITE_OK;
}